

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.h
# Opt level: O2

void __thiscall covenant::CFG::eliminateEpsilon(CFG *this)

{
  long lVar1;
  pointer pvVar2;
  pointer ppVar3;
  bool bVar4;
  size_type sVar5;
  Rule *pRVar6;
  pointer pvVar7;
  pointer pvVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  vector<std::pair<covenant::Sym,_covenant::Rule>,_std::allocator<std::pair<covenant::Sym,_covenant::Rule>_>_>
  newRules;
  TermFactory local_118;
  Sym nt;
  Rule local_100;
  long local_d8;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> OldRHS;
  set<covenant::Sym,_std::less<covenant::Sym>,_std::allocator<covenant::Sym>_> NullableSymbols;
  pair<covenant::Sym,_covenant::Rule> local_88;
  Rule local_58;
  
  NullableSymbols._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &NullableSymbols._M_t._M_impl.super__Rb_tree_header._M_header;
  NullableSymbols._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  NullableSymbols._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  NullableSymbols._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pvVar8 = (this->prods).
           super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar10 = 0;
  NullableSymbols._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       NullableSymbols._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    uVar12 = (ulong)uVar10;
    pvVar7 = (this->prods).
             super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)(((long)pvVar7 - (long)pvVar8) / 0x18) <= uVar12) break;
    uVar9 = 0;
    while( true ) {
      lVar1 = *(long *)&pvVar8[uVar12].
                        super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                        ._M_impl.super__Vector_impl_data;
      if ((ulong)((long)*(pointer *)
                         ((long)&pvVar8[uVar12].
                                 super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                                 ._M_impl.super__Vector_impl_data + 8) - lVar1 >> 2) <= (ulong)uVar9
         ) break;
      iVar11 = *(int *)(lVar1 + (ulong)uVar9 * 4);
      pvVar2 = (this->rules).
               super__Vector_base<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar2[iVar11].super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                   _M_impl.super__Vector_impl_data + 8) ==
          pvVar2[iVar11].super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
          super__Vector_impl_data._M_start) {
        nt.x = uVar10 * 2 + 1;
        std::
        _Rb_tree<covenant::Sym,covenant::Sym,std::_Identity<covenant::Sym>,std::less<covenant::Sym>,std::allocator<covenant::Sym>>
        ::_M_insert_unique<covenant::Sym_const&>
                  ((_Rb_tree<covenant::Sym,covenant::Sym,std::_Identity<covenant::Sym>,std::less<covenant::Sym>,std::allocator<covenant::Sym>>
                    *)&NullableSymbols,&nt);
        removeRule(this,uVar10,uVar9);
        pvVar8 = (this->prods).
                 super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      uVar9 = uVar9 + 1;
    }
    uVar10 = uVar10 + 1;
  }
  newRules.
  super__Vector_base<std::pair<covenant::Sym,_covenant::Rule>,_std::allocator<std::pair<covenant::Sym,_covenant::Rule>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  newRules.
  super__Vector_base<std::pair<covenant::Sym,_covenant::Rule>,_std::allocator<std::pair<covenant::Sym,_covenant::Rule>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  newRules.
  super__Vector_base<std::pair<covenant::Sym,_covenant::Rule>,_std::allocator<std::pair<covenant::Sym,_covenant::Rule>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar10 = 0;
  do {
    if ((ulong)(((long)pvVar7 - (long)pvVar8) / 0x18) <= (ulong)uVar10) {
      while (newRules.
             super__Vector_base<std::pair<covenant::Sym,_covenant::Rule>,_std::allocator<std::pair<covenant::Sym,_covenant::Rule>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             newRules.
             super__Vector_base<std::pair<covenant::Sym,_covenant::Rule>,_std::allocator<std::pair<covenant::Sym,_covenant::Rule>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
        std::pair<covenant::Sym,_covenant::Rule>::pair
                  ((pair<covenant::Sym,_covenant::Rule> *)&nt,
                   newRules.
                   super__Vector_base<std::pair<covenant::Sym,_covenant::Rule>,_std::allocator<std::pair<covenant::Sym,_covenant::Rule>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1);
        bVar4 = isRedundantRule(this,nt,&local_100);
        if (!bVar4) {
          prod(this,nt,&local_100);
        }
        ppVar3 = newRules.
                 super__Vector_base<std::pair<covenant::Sym,_covenant::Rule>,_std::allocator<std::pair<covenant::Sym,_covenant::Rule>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
        newRules.
        super__Vector_base<std::pair<covenant::Sym,_covenant::Rule>,_std::allocator<std::pair<covenant::Sym,_covenant::Rule>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             newRules.
             super__Vector_base<std::pair<covenant::Sym,_covenant::Rule>,_std::allocator<std::pair<covenant::Sym,_covenant::Rule>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
        Rule::~Rule(&ppVar3->second);
        Rule::~Rule(&local_100);
      }
      std::
      vector<std::pair<covenant::Sym,_covenant::Rule>,_std::allocator<std::pair<covenant::Sym,_covenant::Rule>_>_>
      ::~vector(&newRules);
      std::
      _Rb_tree<covenant::Sym,_covenant::Sym,_std::_Identity<covenant::Sym>,_std::less<covenant::Sym>,_std::allocator<covenant::Sym>_>
      ::~_Rb_tree(&NullableSymbols._M_t);
      return;
    }
    iVar11 = uVar10 * 2 + 1;
    uVar9 = 0;
    local_d8 = (ulong)uVar10 * 0x18;
    while( true ) {
      lVar1 = *(long *)((long)&(pvVar8->
                               super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                               )._M_impl.super__Vector_impl_data + local_d8);
      if ((ulong)(*(long *)((long)&(pvVar8->
                                   super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                                   )._M_impl.super__Vector_impl_data + local_d8 + 8) - lVar1 >> 2)
          <= (ulong)uVar9) break;
      std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                (&OldRHS,(this->rules).
                         super__Vector_base<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                         *(int *)(lVar1 + (ulong)uVar9 * 4));
      if ((long)OldRHS.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)OldRHS.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
                super__Vector_impl_data._M_start == 4) {
        sVar5 = std::set<covenant::Sym,_std::less<covenant::Sym>,_std::allocator<covenant::Sym>_>::
                count(&NullableSymbols,
                      OldRHS.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                      _M_impl.super__Vector_impl_data._M_start);
        if (sVar5 == 0) goto LAB_0015dc1e;
        removeRule(this,uVar10,uVar9);
        nt.x = iVar11;
        std::
        _Rb_tree<covenant::Sym,_covenant::Sym,_std::_Identity<covenant::Sym>,_std::less<covenant::Sym>,_std::allocator<covenant::Sym>_>
        ::_M_insert_unique<covenant::Sym>(&NullableSymbols._M_t,&nt);
      }
      else {
LAB_0015dc1e:
        replaceNullableSymbol
                  ((set<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::less<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
                    *)&nt,this,&OldRHS,&NullableSymbols);
        for (pRVar6 = (Rule *)local_100._syms.
                              super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                              _M_impl.super__Vector_impl_data._M_start; pRVar6 != &local_100;
            pRVar6 = (Rule *)std::_Rb_tree_increment((_Rb_tree_node_base *)pRVar6)) {
          local_118.px = (this->_tfac).px;
          local_118.pn.pi_ = (this->_tfac).pn.pi_;
          if (local_118.pn.pi_ != (sp_counted_base *)0x0) {
            LOCK();
            (local_118.pn.pi_)->use_count_ = (local_118.pn.pi_)->use_count_ + 1;
            UNLOCK();
          }
          Rule::Rule(&local_58,
                     (vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                     &(pRVar6->_syms).
                      super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,&local_118);
          local_88.first.x = iVar11;
          Rule::Rule(&local_88.second,&local_58);
          std::
          vector<std::pair<covenant::Sym,covenant::Rule>,std::allocator<std::pair<covenant::Sym,covenant::Rule>>>
          ::emplace_back<std::pair<covenant::Sym,covenant::Rule>>
                    ((vector<std::pair<covenant::Sym,covenant::Rule>,std::allocator<std::pair<covenant::Sym,covenant::Rule>>>
                      *)&newRules,&local_88);
          Rule::~Rule(&local_88.second);
          Rule::~Rule(&local_58);
          boost::detail::shared_count::~shared_count(&local_118.pn);
        }
        std::
        _Rb_tree<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::_Identity<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>,_std::less<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::_Identity<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>,_std::less<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
                     *)&nt);
      }
      std::_Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>::~_Vector_base
                (&OldRHS.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>);
      uVar9 = uVar9 + 1;
      pvVar8 = (this->prods).
               super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    uVar10 = uVar10 + 1;
    pvVar7 = (this->prods).
             super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  } while( true );
}

Assistant:

void replaceNonTerminal (vector<Sym> &SymVec, Sym s)
    {
      for (unsigned int i=0; i<SymVec.size (); ++i)
      {
        if (SymVec [i].isVar () && (SymVec [i] == s))
        {
          Sym FreshNonTerm = newVar();
          prod (FreshNonTerm, Rule::E (_tfac) << SymVec [i]);
          SymVec [i] = FreshNonTerm;
        }
      }
    }